

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::fastAccessDx
          (FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_> *this,
          int i)

{
  value_type_conflict1 *pvVar1;
  FadCst<double> *in_RDI;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar2 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::fastAccessDx
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_RDI,
                     in_stack_ffffffffffffffdc);
  pvVar1 = FadCst<double>::val(in_RDI);
  return vVar2 * *pvVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return right_.fastAccessDx(i) * left_.val();}